

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genBlockSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          deInt64 numSSBlocks,GLenum shaderType)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar2;
  char *pcVar3;
  ostream *poVar4;
  GLenum glShaderType;
  char *local_1f0;
  undefined1 local_1b0 [8];
  ostringstream source;
  GLSLVersion version;
  bool isES32;
  GLenum shaderType_local;
  deInt64 numSSBlocks_local;
  NegativeTestContext *ctx_local;
  
  glShaderType = (GLenum)numSSBlocks;
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  source._372_4_ = bVar1 | 2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  pcVar3 = glu::getGLSLVersionDeclaration(source._372_4_);
  poVar4 = std::operator<<((ostream *)local_1b0,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  if (bVar1) {
    local_1f0 = "";
  }
  else {
    local_1f0 = anon_unknown_4::getShaderExtensionDeclaration(glShaderType);
  }
  std::operator<<(poVar4,local_1f0);
  if (1 < glShaderType - 0x8b30) {
    if (glShaderType == 0x8dd9) {
      poVar4 = std::operator<<((ostream *)local_1b0,"layout(points) in;\n");
      std::operator<<(poVar4,"layout(line_strip, max_vertices = 3) out;\n");
    }
    else if (glShaderType == 0x8e87) {
      std::operator<<((ostream *)local_1b0,"layout(triangles) in;\n");
    }
    else if (glShaderType == 0x8e88) {
      std::operator<<((ostream *)local_1b0,"layout(vertices = 10) out;\n");
    }
    else if (glShaderType == 0x91b9) {
      std::operator<<((ostream *)local_1b0,"layout (local_size_x = 1) in;\n");
    }
  }
  poVar4 = std::operator<<((ostream *)local_1b0,"\n");
  poVar4 = std::operator<<(poVar4,"layout(std430, binding = 0) buffer Block {\n");
  poVar4 = std::operator<<(poVar4,"    int value;\n");
  poVar4 = std::operator<<(poVar4,"} sb_in[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)ctx);
  poVar4 = std::operator<<(poVar4,"];\n");
  std::operator<<(poVar4,"void main(void) { sb_in[0].value = 1; }\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string genBlockSource (NegativeTestContext& ctx, deInt64 numSSBlocks, glw::GLenum shaderType)
{
	const bool				isES32		= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version		= isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	std::ostringstream		source;

	source	<< glu::getGLSLVersionDeclaration(version) << "\n"
			<< ((isES32) ? "" : getShaderExtensionDeclaration(shaderType));

	switch (shaderType)
	{
		case GL_VERTEX_SHADER:
		case GL_FRAGMENT_SHADER:
			break;

		case GL_COMPUTE_SHADER:
			source << "layout (local_size_x = 1) in;\n";
			break;

		case GL_GEOMETRY_SHADER:
			source << "layout(points) in;\n"
				   << "layout(line_strip, max_vertices = 3) out;\n";
			break;

		case GL_TESS_CONTROL_SHADER:
			source << "layout(vertices = 10) out;\n";
			break;

		case GL_TESS_EVALUATION_SHADER:
			source << "layout(triangles) in;\n";
			break;

		default:
			DE_FATAL("Unknown shader type");
			break;
	}

	source  << "\n"
			<< "layout(std430, binding = 0) buffer Block {\n"
			<< "    int value;\n"
			<< "} sb_in[" << numSSBlocks << "];\n"
			<< "void main(void) { sb_in[0].value = 1; }\n";

	return source.str();
}